

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

char * upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder *e,char *ptr,uint32_t val)

{
  uint val_00;
  
  *(char **)e->internal = ptr;
  val_00 = val - *(uint *)(e->internal + 0x10);
  if (val < *(uint *)(e->internal + 0x10)) {
    __assert_fail("val >= in->state.enum_state.last_written_value",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                  ,0x129,
                  "char *upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder *, char *, uint32_t)");
  }
  if ((4 < val_00) && (*(long *)(e->internal + 8) != 0)) {
    ptr = upb_MtDataEncoder_Put(e,ptr,e->internal[8]);
    e->internal[8] = '\0';
    e->internal[9] = '\0';
    e->internal[10] = '\0';
    e->internal[0xb] = '\0';
    e->internal[0xc] = '\0';
    e->internal[0xd] = '\0';
    e->internal[0xe] = '\0';
    e->internal[0xf] = '\0';
    *(int *)(e->internal + 0x10) = *(int *)(e->internal + 0x10) + 5;
    if (ptr == (char *)0x0) {
      return (char *)0x0;
    }
    val_00 = val_00 - 5;
  }
  if (4 < val_00) {
    ptr = upb_MtDataEncoder_PutBase92Varint(e,ptr,val_00,0x5f,0x7e);
    *(uint *)(e->internal + 0x10) = *(int *)(e->internal + 0x10) + val_00;
    val_00 = 0;
  }
  if (*(ulong *)(e->internal + 8) >> ((byte)val_00 & 0x3f) == 0) {
    *(ulong *)(e->internal + 8) = *(ulong *)(e->internal + 8) | 1L << ((ulong)val_00 & 0x3f);
    return ptr;
  }
  __assert_fail("(in->state.enum_state.present_values_mask >> delta) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                ,0x13a,"char *upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder *, char *, uint32_t)"
               );
}

Assistant:

char* upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder* e, char* ptr,
                                     uint32_t val) {
  // TODO: optimize this encoding.
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  UPB_ASSERT(val >= in->state.enum_state.last_written_value);
  uint32_t delta = val - in->state.enum_state.last_written_value;
  if (delta >= 5 && in->state.enum_state.present_values_mask) {
    ptr = upb_MtDataEncoder_FlushDenseEnumMask(e, ptr);
    if (!ptr) {
      return NULL;
    }
    delta -= 5;
  }

  if (delta >= 5) {
    ptr = upb_MtDataEncoder_PutBase92Varint(
        e, ptr, delta, kUpb_EncodedValue_MinSkip, kUpb_EncodedValue_MaxSkip);
    in->state.enum_state.last_written_value += delta;
    delta = 0;
  }

  UPB_ASSERT((in->state.enum_state.present_values_mask >> delta) == 0);
  in->state.enum_state.present_values_mask |= 1ULL << delta;
  return ptr;
}